

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (QuadRenderer *renderer,RenderCommand *command,int viewportX,int viewportY)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  bool *pbVar5;
  float local_f4;
  float local_e8;
  Vector<float,_2> local_e4;
  Vector<float,_2> local_dc;
  byte local_d1;
  undefined1 auStack_d0 [7];
  bool isFrontFacing;
  Quad quad;
  StencilParams *sParams;
  deUint32 glFace;
  int face;
  int viewportY_local;
  int viewportX_local;
  RenderCommand *command_local;
  QuadRenderer *renderer_local;
  
  if (((command->params).stencilTestEnabled & 1U) == 0) {
    glwDisable(0xb90);
  }
  else {
    glwEnable(0xb90);
    for (sParams._4_4_ = 0; sParams._4_4_ < 2; sParams._4_4_ = sParams._4_4_ + 1) {
      GVar4 = 0x404;
      if (sParams._4_4_ == 1) {
        GVar4 = 0x405;
      }
      quad.depth._8_8_ = (command->params).stencil + sParams._4_4_;
      glwStencilFuncSeparate
                (GVar4,((StencilParams *)quad.depth._8_8_)->function,
                 ((StencilParams *)quad.depth._8_8_)->reference,
                 ((StencilParams *)quad.depth._8_8_)->compareMask);
      glwStencilOpSeparate
                (GVar4,*(GLenum *)(quad.depth._8_8_ + 0xc),*(GLenum *)(quad.depth._8_8_ + 0x10),
                 *(GLenum *)(quad.depth._8_8_ + 0x14));
      glwStencilMaskSeparate(GVar4,*(GLuint *)(quad.depth._8_8_ + 0x18));
    }
  }
  if (((command->params).depthTestEnabled & 1U) == 0) {
    glwDisable(0xb71);
  }
  else {
    glwEnable(0xb71);
    glwDepthFunc((command->params).depthFunc);
    glwDepthMask(((command->params).depthWriteMask & 1U) != 0);
  }
  pbVar5 = tcu::Vector<bool,_4>::operator[](&command->colorMask,0);
  bVar1 = *pbVar5;
  pbVar5 = tcu::Vector<bool,_4>::operator[](&command->colorMask,1);
  bVar2 = *pbVar5;
  pbVar5 = tcu::Vector<bool,_4>::operator[](&command->colorMask,2);
  bVar3 = *pbVar5;
  pbVar5 = tcu::Vector<bool,_4>::operator[](&command->colorMask,3);
  glwColorMask((bVar1 & 1U) != 0,(bVar2 & 1U) != 0,(bVar3 & 1U) != 0,(*pbVar5 & 1U) != 0);
  glwViewport((command->rect).left + viewportX,(command->rect).bottom + viewportY,
              (command->rect).width,(command->rect).height);
  deqp::gls::FragmentOpUtil::Quad::Quad((Quad *)auStack_d0);
  local_d1 = (command->params).visibleFace == FACETYPE_FRONT;
  local_e8 = -1.0;
  if (!(bool)local_d1) {
    local_e8 = 1.0;
  }
  tcu::Vector<float,_2>::Vector(&local_dc,local_e8,-1.0);
  auStack_d0._0_4_ = local_dc.m_data[0];
  stack0xffffffffffffff34 = local_dc.m_data[1];
  local_f4 = 1.0;
  if ((local_d1 & 1) == 0) {
    local_f4 = -1.0;
  }
  tcu::Vector<float,_2>::Vector(&local_e4,local_f4,1.0);
  quad.posA.m_data[0] = local_e4.m_data[0];
  quad.posA.m_data[1] = local_e4.m_data[1];
  std::fill<tcu::Vector<float,4>*,tcu::Vector<float,4>>
            ((Vector<float,_4> *)&quad.posB,(Vector<float,_4> *)(quad.color[3].m_data + 2),
             &command->color);
  std::fill<float*,float>(quad.color1[3].m_data + 2,quad.depth + 2,&(command->params).depth);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(renderer,(Quad *)auStack_d0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDepthStencilTests.cpp"
                  ,0x1de);
  return;
}

Assistant:

void render (gls::FragmentOpUtil::QuadRenderer& renderer, const RenderCommand& command, int viewportX, int viewportY)
{
	if (command.params.stencilTestEnabled)
	{
		glEnable(GL_STENCIL_TEST);

		for (int face = 0; face < rr::FACETYPE_LAST; face++)
		{
			deUint32				glFace	= face == rr::FACETYPE_BACK ? GL_BACK : GL_FRONT;
			const StencilParams&	sParams	= command.params.stencil[face];

			glStencilFuncSeparate(glFace, sParams.function, sParams.reference, sParams.compareMask);
			glStencilOpSeparate(glFace, sParams.stencilFailOp, sParams.depthFailOp, sParams.depthPassOp);
			glStencilMaskSeparate(glFace, sParams.writeMask);
		}
	}
	else
		glDisable(GL_STENCIL_TEST);

	if (command.params.depthTestEnabled)
	{
		glEnable(GL_DEPTH_TEST);
		glDepthFunc(command.params.depthFunc);
		glDepthMask(command.params.depthWriteMask ? GL_TRUE : GL_FALSE);
	}
	else
		glDisable(GL_DEPTH_TEST);

	glColorMask(command.colorMask[0] ? GL_TRUE : GL_FALSE,
				command.colorMask[1] ? GL_TRUE : GL_FALSE,
				command.colorMask[2] ? GL_TRUE : GL_FALSE,
				command.colorMask[3] ? GL_TRUE : GL_FALSE);
	glViewport(command.rect.left+viewportX, command.rect.bottom+viewportY, command.rect.width, command.rect.height);

	gls::FragmentOpUtil::Quad quad;

	bool isFrontFacing = command.params.visibleFace == rr::FACETYPE_FRONT;
	quad.posA = Vec2(isFrontFacing ? -1.0f :  1.0f, -1.0f);
	quad.posB = Vec2(isFrontFacing ?  1.0f : -1.0f,  1.0f);

	std::fill(DE_ARRAY_BEGIN(quad.color), DE_ARRAY_END(quad.color), command.color);
	std::fill(DE_ARRAY_BEGIN(quad.depth), DE_ARRAY_END(quad.depth), command.params.depth);

	renderer.render(quad);
	GLU_CHECK();
}